

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O3

void __thiscall KDReports::ReportPrivate::debugLayoutToPdf(ReportPrivate *this,char *fileName)

{
  char cVar1;
  undefined8 extraout_RAX;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QPrinter printer;
  QFile html;
  QString htmlText;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  undefined1 local_70 [24];
  char16_t *local_58;
  qsizetype qStack_50;
  QArrayDataPointer<char16_t> local_48;
  char *local_30;
  
  local_48.d = (Data *)fileName;
  ::QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)&local_88,(char **)&local_48);
  QVar2.m_data = (storage_type *)local_88.d;
  QVar2.m_size = (qsizetype)(local_70 + 0x10);
  QString::fromLocal8Bit(QVar2);
  local_88.d = (Data *)0x0;
  local_88.ptr = L".html";
  local_88.size = 5;
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  local_48.size = 0;
  local_a8.d = (Data *)local_70._16_8_;
  local_a8.ptr = local_58;
  local_a8.size = qStack_50;
  if ((Data *)local_70._16_8_ != (Data *)0x0) {
    LOCK();
    (((QArrayData *)local_70._16_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)local_70._16_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::append((QString *)&local_a8);
  QFile::QFile((QFile *)local_70,(QString *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_70 + 0x10));
  cVar1 = QFile::open(local_70,2);
  if (cVar1 != '\0') {
    (*this->m_layout->_vptr_AbstractReportLayout[0x13])(local_70 + 0x10);
    QString::toUtf8_helper((QString *)&local_a8);
    QIODevice::write((QByteArray *)local_70);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_a8);
    QFileDevice::close();
    this->m_pageContentSizeDirty = false;
    QPrinter::QPrinter((QPrinter *)&local_a8,0);
    Report::setupPrinter(this->q,(QPrinter *)&local_a8);
    local_30 = fileName;
    ::QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_48,&local_30);
    QVar3.m_data = (storage_type *)local_48.d;
    QVar3.m_size = (qsizetype)&local_88;
    QString::fromLocal8Bit(QVar3);
    QPrinter::setOutputFileName((QString *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    doPrint(this,(QPrinter *)&local_a8,(QWidget *)0x0);
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_88.size = 0;
    QPrinter::setOutputFileName((QString *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    this->m_pageContentSizeDirty = true;
    QPrinter::~QPrinter((QPrinter *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)(local_70 + 0x10));
    QFile::~QFile((QFile *)local_70);
    return;
  }
  debugLayoutToPdf();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QPrinter::~QPrinter((QPrinter *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_70 + 0x10));
  QFile::~QFile((QFile *)local_70);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void KDReports::ReportPrivate::debugLayoutToPdf(const char *fileName)
{
    // for calling from gdb

    QFile html(QFile::decodeName(fileName) + QStringLiteral(".html"));
    Q_ASSERT(html.open(QIODevice::WriteOnly));
    const QString htmlText = m_layout->toHtml();
    html.write(htmlText.toUtf8());
    html.close();

    bool oldLayoutDirty = true;
    m_pageContentSizeDirty = false;
    QPrinter printer;
    q->setupPrinter(&printer);
    printer.setOutputFileName(QFile::decodeName(fileName));
    doPrint(&printer, nullptr);
    printer.setOutputFileName(QString());
    m_pageContentSizeDirty = oldLayoutDirty;
}